

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexMin1.c
# Opt level: O0

void Saig_ManCexMinGetCos(Aig_Man_t *pAig,Abc_Cex_t *pCex,Vec_Int_t *vLeaves,Vec_Int_t *vRoots)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  int local_34;
  int i;
  Aig_Obj_t *pObj;
  Vec_Int_t *vRoots_local;
  Vec_Int_t *vLeaves_local;
  Abc_Cex_t *pCex_local;
  Aig_Man_t *pAig_local;
  
  Vec_IntClear(vRoots);
  if (vLeaves == (Vec_Int_t *)0x0) {
    pAVar2 = Aig_ManCo(pAig,pCex->iPo);
    iVar1 = Aig_ObjId(pAVar2);
    Vec_IntPush(vRoots,iVar1);
  }
  else {
    for (local_34 = 0; iVar1 = Vec_IntSize(vLeaves), local_34 < iVar1; local_34 = local_34 + 1) {
      iVar1 = Vec_IntEntry(vLeaves,local_34);
      pAVar2 = Aig_ManObj(pAig,iVar1);
      iVar1 = Saig_ObjIsLo(pAig,pAVar2);
      if (iVar1 != 0) {
        pAVar2 = Saig_ObjLoToLi(pAig,pAVar2);
        iVar1 = Aig_ObjId(pAVar2);
        Vec_IntPush(vRoots,iVar1);
      }
    }
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Find the roots to begin traversal.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Saig_ManCexMinGetCos( Aig_Man_t * pAig, Abc_Cex_t * pCex, Vec_Int_t * vLeaves, Vec_Int_t * vRoots )
{
    Aig_Obj_t * pObj;
    int i;
    Vec_IntClear( vRoots );
    if ( vLeaves == NULL )
    {
        pObj = Aig_ManCo( pAig, pCex->iPo );
        Vec_IntPush( vRoots, Aig_ObjId(pObj) );
        return;
    }
    Aig_ManForEachObjVec( vLeaves, pAig, pObj, i )
        if ( Saig_ObjIsLo(pAig, pObj) )
            Vec_IntPush( vRoots, Aig_ObjId( Saig_ObjLoToLi(pAig, pObj) ) );
}